

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderDuration
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  StringPiece error_message;
  StringPiece error_message_00;
  StringPiece error_message_01;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  AlphaNum *b;
  undefined1 auVar3 [8];
  char *pcVar4;
  uint uVar5;
  undefined8 this_00;
  long lVar6;
  char *pcVar7;
  pair<long,_int> pVar8;
  string local_f0;
  undefined1 local_c0 [8];
  string formatted_duration;
  string local_88;
  char *local_68;
  size_type *local_60;
  undefined1 local_58 [8];
  string sign;
  
  pcVar4 = field_name.ptr_;
  sign.field_2._8_8_ = __return_storage_ptr__;
  pVar8 = ReadSecondsAndNanos(this,(Type *)os);
  lVar6 = pVar8.first;
  b = (AlphaNum *)0xffffff6d0c68c3fe;
  if (lVar6 - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
    local_f0._M_dataplus._M_p = "Duration seconds exceeds limit for field: ";
    local_f0._M_string_length = 0x2a;
    local_c0 = (undefined1  [8])type;
    formatted_duration._M_dataplus._M_p = pcVar4;
    StrCat_abi_cxx11_((string *)local_58,(protobuf *)&local_f0,(AlphaNum *)local_c0,
                      (AlphaNum *)0xffffff6d0c68c3fe);
    this_00 = sign.field_2._8_8_;
    error_message_00.length_ = (stringpiece_ssize_type)sign._M_dataplus._M_p;
    error_message_00.ptr_ = (char *)local_58;
    if ((long)sign._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)sign._M_dataplus._M_p,"size_t to int conversion");
    }
    Status::Status((Status *)this_00,INTERNAL,error_message_00);
    goto LAB_00316946;
  }
  uVar5 = pVar8.second;
  if (uVar5 + 0xc4653600 < 0x88ca6c01) {
    local_f0._M_dataplus._M_p = "Duration nanos exceeds limit for field: ";
    local_f0._M_string_length = 0x28;
    local_c0 = (undefined1  [8])type;
    formatted_duration._M_dataplus._M_p = pcVar4;
    StrCat_abi_cxx11_((string *)local_58,(protobuf *)&local_f0,(AlphaNum *)local_c0,
                      (AlphaNum *)0xffffff6d0c68c3fe);
    this_00 = sign.field_2._8_8_;
    error_message_01.length_ = (stringpiece_ssize_type)sign._M_dataplus._M_p;
    error_message_01.ptr_ = (char *)local_58;
    if ((long)sign._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)sign._M_dataplus._M_p,"size_t to int conversion");
    }
    Status::Status((Status *)this_00,INTERNAL,error_message_01);
    goto LAB_00316946;
  }
  local_58 = (undefined1  [8])&sign._M_string_length;
  pcVar7 = "";
  local_68 = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"","");
  if (lVar6 < 0) {
    if ((int)uVar5 < 1) {
      std::__cxx11::string::_M_replace((ulong)local_58,0,sign._M_dataplus._M_p,0x34576c);
      lVar6 = -lVar6;
      uVar5 = -uVar5;
      goto LAB_003167e0;
    }
    local_f0._M_dataplus._M_p =
         "Duration nanos is non-negative, but seconds is negative for field: ";
    local_f0._M_string_length = 0x43;
    formatted_duration._M_dataplus._M_p = local_68;
    local_c0 = (undefined1  [8])type;
    StrCat_abi_cxx11_(&local_88,(protobuf *)&local_f0,(AlphaNum *)local_c0,b);
    this_00 = sign.field_2._8_8_;
    error_message.length_ = local_88._M_string_length;
    error_message.ptr_ = local_88._M_dataplus._M_p;
    if ((long)local_88._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_88._M_string_length,"size_t to int conversion");
    }
    Status::Status((Status *)this_00,INTERNAL,error_message);
    paVar2 = &local_88.field_2;
  }
  else {
    if ((int)uVar5 < 0 && lVar6 == 0) {
      std::__cxx11::string::_M_replace((ulong)local_58,0,sign._M_dataplus._M_p,0x34576c);
      uVar5 = -uVar5;
      lVar6 = 0;
LAB_003167f5:
      auVar3 = local_58;
      if ((uVar5 * 0x26e978d5 >> 3 | uVar5 * -0x60000000) < 0x418938) {
        pcVar4 = "%.6f";
        if ((uVar5 * 0x68c26139 >> 6 | uVar5 * -0x1c000000) < 0x10c7) {
          pcVar4 = "%.3f";
        }
      }
      else {
        pcVar4 = "%.9f";
      }
      StringPrintf_abi_cxx11_(&local_f0,pcVar4,(double)uVar5 / 1000000000.0);
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    else {
LAB_003167e0:
      local_60 = (size_type *)local_58;
      if (uVar5 != 0) goto LAB_003167f5;
      if (this->add_trailing_zeros_for_timestamp_and_duration_ != false) {
        pcVar7 = ".000";
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,pcVar7,
                 pcVar7 + (ulong)this->add_trailing_zeros_for_timestamp_and_duration_ * 4);
      auVar3 = (undefined1  [8])local_60;
    }
    StringPrintf_abi_cxx11_((string *)local_c0,"%s%lld%ss",auVar3,lVar6,local_88._M_dataplus._M_p);
    this_00 = sign.field_2._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    _Var1._M_p = formatted_duration._M_dataplus._M_p;
    auVar3 = local_c0;
    if ((long)formatted_duration._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig
                ((size_t)formatted_duration._M_dataplus._M_p,"size_t to int conversion");
    }
    (**(code **)(*(long *)field_name.length_ + 0x68))
              ((long *)field_name.length_,type,local_68,auVar3,_Var1._M_p);
    Status::Status((Status *)this_00);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&formatted_duration._M_string_length;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar2->_M_allocated_capacity)[-2] != paVar2) {
    operator_delete((undefined1 *)(&paVar2->_M_allocated_capacity)[-2]);
  }
LAB_00316946:
  if (local_58 != (undefined1  [8])&sign._M_string_length) {
    operator_delete((void *)local_58);
  }
  return (Status *)this_00;
}

Assistant:

Status ProtoStreamObjectSource::RenderDuration(
    const ProtoStreamObjectSource* os, const google::protobuf::Type& type,
    StringPiece field_name, ObjectWriter* ow) {
  std::pair<int64, int32> p = os->ReadSecondsAndNanos(type);
  int64 seconds = p.first;
  int32 nanos = p.second;
  if (seconds > kDurationMaxSeconds || seconds < kDurationMinSeconds) {
    return Status(
        util::error::INTERNAL,
        StrCat("Duration seconds exceeds limit for field: ", field_name));
  }

  if (nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    return Status(
        util::error::INTERNAL,
        StrCat("Duration nanos exceeds limit for field: ", field_name));
  }

  std::string sign = "";
  if (seconds < 0) {
    if (nanos > 0) {
      return Status(
          util::error::INTERNAL,
          StrCat("Duration nanos is non-negative, but seconds is "
                       "negative for field: ",
                       field_name));
    }
    sign = "-";
    seconds = -seconds;
    nanos = -nanos;
  } else if (seconds == 0 && nanos < 0) {
    sign = "-";
    nanos = -nanos;
  }
  std::string formatted_duration = StringPrintf(
      "%s%lld%ss", sign.c_str(), static_cast<long long>(seconds),  // NOLINT
      FormatNanos(nanos, os->add_trailing_zeros_for_timestamp_and_duration_)
          .c_str());
  ow->RenderString(field_name, formatted_duration);
  return util::Status();
}